

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImPool<ImGuiTabBar>::Clear(ImPool<ImGuiTabBar> *this)

{
  ImGuiStoragePair *pIVar1;
  long in_RDI;
  int idx;
  int n;
  int in_stack_fffffffffffffff0;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x10); iVar2 = iVar2 + 1) {
    pIVar1 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                       ((ImVector<ImGuiStorage::ImGuiStoragePair> *)
                        CONCAT44(iVar2,in_stack_fffffffffffffff0),(int)((ulong)in_RDI >> 0x20));
    in_stack_fffffffffffffff0 = (pIVar1->field_1).val_i;
    if (in_stack_fffffffffffffff0 != -1) {
      ImVector<ImGuiTabBar>::operator[]
                ((ImVector<ImGuiTabBar> *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                 (int)((ulong)in_RDI >> 0x20));
      ImGuiTabBar::~ImGuiTabBar((ImGuiTabBar *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
    }
  }
  ImGuiStorage::Clear((ImGuiStorage *)0x1d8487);
  ImVector<ImGuiTabBar>::clear((ImVector<ImGuiTabBar> *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  *(undefined4 *)(in_RDI + 0x20) = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = 0; }